

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O3

void Acb_ObjAddFanins(Acb_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int *piVar5;
  
  if ((vFanins != (Vec_Int_t *)0x0) && (0 < vFanins->nSize)) {
    if (iObj < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
    }
    piVar3 = vFanins->pArray;
    lVar4 = 0;
    do {
      if ((p->vObjFans).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = (p->vObjFans).pArray[(uint)iObj];
      if (((long)iVar1 < 0) || ((p->vFanSto).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = piVar3[lVar4];
      if (iVar2 < 1) {
        __assert_fail("iFanin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      piVar5 = (p->vFanSto).pArray + iVar1;
      iVar1 = *piVar5;
      if (piVar5[(long)iVar1 + 1] != -1) {
        __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      *piVar5 = iVar1 + 1;
      piVar5[(long)iVar1 + 1] = iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFanins->nSize);
  }
  return;
}

Assistant:

static inline void Acb_ObjAddFanins( Acb_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    if ( vFanins )
        Vec_IntForEachEntry( vFanins, iFanin, i )
            Acb_ObjAddFanin( p, iObj, iFanin );
}